

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Match(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              *uri,bool full)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (&uri->uri_)[!full];
  pcVar3 = (&this->uri_)[!full];
  if (pcVar3 == pcVar2) {
    return true;
  }
  if (pcVar2 != (char *)0x0 && pcVar3 != (char *)0x0) {
    cVar1 = *pcVar3;
    while ((cVar1 != '\0' && (pcVar3 = pcVar3 + 1, cVar1 == *pcVar2))) {
      pcVar2 = pcVar2 + 1;
      cVar1 = *pcVar3;
    }
    return cVar1 == *pcVar2;
  }
  return false;
}

Assistant:

bool Match(const GenericUri& uri, bool full = true) const {
        Ch* s1;
        Ch* s2;
        if (full) {
            s1 = uri_;
            s2 = uri.uri_;
        } else {
            s1 = base_;
            s2 = uri.base_;
        }
        if (s1 == s2) return true;
        if (s1 == 0 || s2 == 0) return false;
        return internal::StrCmp<Ch>(s1, s2) == 0;
    }